

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

double __thiscall Mat::Dot(Mat *this,Mat *rhs)

{
  int iVar1;
  int iVar2;
  ostream *this_00;
  int local_24;
  double dStack_20;
  int i;
  double Sum;
  Mat *rhs_local;
  Mat *this_local;
  
  iVar1 = Size(this);
  iVar2 = Size(rhs);
  if (iVar1 != iVar2) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "ERROR: Incompatible shape in Dot(Vector,Vector)");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  dStack_20 = 0.0;
  local_24 = 0;
  while( true ) {
    iVar1 = Size(this);
    if (iVar1 <= local_24) break;
    dStack_20 = this->v_[local_24] * rhs->v_[local_24] + dStack_20;
    local_24 = local_24 + 1;
  }
  return dStack_20;
}

Assistant:

double Mat::Dot(const Mat &rhs)
{
	if ((*this).Size()!=rhs.Size()) {
		cerr << "ERROR: Incompatible shape in Dot(Vector,Vector)" << endl;
		exit(1);
	};
	double Sum = 0.0;
	for (int i=0; i<(*this).Size(); i++) Sum+=(*this).v_[i]*rhs.v_[i];
	return Sum;
}